

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void applyAffinity(Mem *pRec,char affinity,u8 enc)

{
  double dVar1;
  ushort uVar2;
  long lVar3;
  
  if (affinity < 'C') {
    if (affinity != 'B') {
      return;
    }
    uVar2 = pRec->flags;
    if ((uVar2 & 0xc) != 0 && (char)((uVar2 & 2) >> 1) == '\0') {
      sqlite3VdbeMemStringify(pRec,enc,'\x01');
      uVar2 = pRec->flags;
    }
    uVar2 = uVar2 & 0xfff3;
  }
  else {
    uVar2 = pRec->flags;
    if ((uVar2 & 4) != 0) {
      return;
    }
    if ((uVar2 & 8) == 0) {
      if ((uVar2 & 2) == 0) {
        return;
      }
      applyNumericAffinity(pRec,1);
      return;
    }
    dVar1 = (pRec->u).r;
    if (9.223372036854776e+18 <= ABS(dVar1)) {
      return;
    }
    lVar3 = (long)dVar1;
    if (0xfffffffffffffffd < lVar3 + 0x7fffffffffffffffU || dVar1 != (double)lVar3) {
      return;
    }
    (pRec->u).i = lVar3;
    uVar2 = uVar2 & 0x3e00 | 4;
  }
  pRec->flags = uVar2;
  return;
}

Assistant:

static void applyAffinity(
  Mem *pRec,          /* The value to apply affinity to */
  char affinity,      /* The affinity to be applied */
  u8 enc              /* Use this text encoding */
){
  if( affinity>=SQLITE_AFF_NUMERIC ){
    assert( affinity==SQLITE_AFF_INTEGER || affinity==SQLITE_AFF_REAL
             || affinity==SQLITE_AFF_NUMERIC );
    if( (pRec->flags & MEM_Int)==0 ){ /*OPTIMIZATION-IF-FALSE*/
      if( (pRec->flags & MEM_Real)==0 ){
        if( pRec->flags & MEM_Str ) applyNumericAffinity(pRec,1);
      }else{
        sqlite3VdbeIntegerAffinity(pRec);
      }
    }
  }else if( affinity==SQLITE_AFF_TEXT ){
    /* Only attempt the conversion to TEXT if there is an integer or real
    ** representation (blob and NULL do not get converted) but no string
    ** representation.  It would be harmless to repeat the conversion if 
    ** there is already a string rep, but it is pointless to waste those
    ** CPU cycles. */
    if( 0==(pRec->flags&MEM_Str) ){ /*OPTIMIZATION-IF-FALSE*/
      if( (pRec->flags&(MEM_Real|MEM_Int)) ){
        sqlite3VdbeMemStringify(pRec, enc, 1);
      }
    }
    pRec->flags &= ~(MEM_Real|MEM_Int);
  }
}